

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Packing_x86_avx::forward_int8
          (Packing_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  char *pcVar2;
  long in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long *in_RDI;
  int i_3;
  char *outptr7_1;
  char *outptr6_1;
  char *outptr5_1;
  char *outptr4_1;
  char *outptr3_1;
  char *outptr2_1;
  char *outptr1_1;
  char *outptr0_1;
  char *r0_3;
  int q_1;
  int i_2;
  char *outptr_1;
  char *r7_1;
  char *r6_1;
  char *r5_1;
  char *r4_1;
  char *r3_1;
  char *r2_1;
  char *r1_1;
  char *r0_2;
  int q;
  size_t out_elemsize_1;
  int outc;
  int size;
  int j_1;
  char *outptr7;
  char *outptr6;
  char *outptr5;
  char *outptr4;
  char *outptr3;
  char *outptr2;
  char *outptr1;
  char *outptr0;
  char *r0_1;
  int i_1;
  int j;
  char *outptr;
  char *r7;
  char *r6;
  char *r5;
  char *r4;
  char *r3;
  char *r2;
  char *r1;
  char *r0;
  int i;
  size_t out_elemsize;
  int outh;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  bool pack8to1;
  bool pack1to8;
  int elempack;
  size_t elemsize;
  Mat *in_stack_fffffffffffff7f0;
  Mat *in_stack_fffffffffffff7f8;
  Mat *pMVar3;
  size_t in_stack_fffffffffffff800;
  int _d;
  int iVar4;
  undefined8 in_stack_fffffffffffff808;
  int _w;
  Mat *in_stack_fffffffffffff810;
  Mat *in_stack_fffffffffffff818;
  Allocator *in_stack_fffffffffffff820;
  Allocator *in_stack_fffffffffffff828;
  bool local_6e2;
  bool local_6e1;
  int local_6d4;
  Mat local_6d0;
  char *local_688;
  Mat local_680;
  Mat *local_638;
  Mat local_630;
  char *local_5e8;
  Mat local_5e0;
  char *local_598;
  Option *in_stack_fffffffffffffa90;
  Mat *in_stack_fffffffffffffa98;
  Mat *in_stack_fffffffffffffaa0;
  Packing *in_stack_fffffffffffffaa8;
  char *local_548;
  Mat local_540;
  char *local_4f8;
  Mat local_4f0;
  char *local_4a8;
  Mat local_4a0;
  char *local_458;
  Mat local_450;
  char *local_408;
  int local_400;
  int local_3fc;
  Mat local_3f8;
  char *local_3b0;
  Mat local_3a8;
  char *local_360;
  Mat local_358;
  char *local_310;
  Mat local_308;
  char *local_2c0;
  Mat local_2b8;
  char *local_270;
  Mat local_268;
  char *local_220;
  Mat local_218;
  char *local_1d0;
  Mat local_1c8;
  char *local_180;
  Mat local_168;
  char *local_120;
  int local_114;
  long local_110;
  int local_104;
  int local_100;
  int local_fc;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  int local_b0;
  int local_ac;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  int local_5c;
  long local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  bool local_36;
  bool local_35;
  int local_34;
  ulong local_30;
  Mat *local_20;
  Mat *local_18;
  int local_4;
  
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
    local_30 = in_RSI->elemsize;
    local_34 = in_RSI->elempack;
    if (local_34 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)) {
      ncnn::Mat::operator=(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
      local_4 = 0;
    }
    else {
      local_6e1 = false;
      if (local_34 == 1) {
        local_6e1 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 8;
      }
      local_35 = local_6e1;
      local_6e2 = false;
      if (local_34 == 8) {
        local_6e2 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1;
      }
      local_36 = local_6e2;
      if ((local_6e1 == false) && (local_6e2 == false)) {
        local_4 = Packing::forward(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                                   in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      }
      else {
        local_3c = in_RSI->w;
        local_40 = in_RSI->h;
        local_44 = in_RSI->d;
        local_48 = in_RSI->c;
        local_4c = in_RSI->dims;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
          if ((local_4c == 1) &&
             ((local_3c * local_34) % *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) !=
              0)) {
            ncnn::Mat::operator=(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
            return 0;
          }
          if ((local_4c == 2) &&
             ((local_40 * local_34) % *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) !=
              0)) {
            ncnn::Mat::operator=(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
            return 0;
          }
          if (((local_4c == 3) || (local_4c == 4)) &&
             ((local_48 * local_34) % *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) !=
              0)) {
            ncnn::Mat::operator=(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
            return 0;
          }
        }
        local_20 = in_RDX;
        if (local_4c == 1) {
          ncnn::Mat::operator=(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
          local_20->w = (local_3c * local_34) /
                        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
          local_20->cstep =
               (long)((local_3c * local_34) /
                     *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
          local_20->elemsize =
               (local_30 / (ulong)(long)local_34) *
               (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
          local_20->elempack = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
          local_4 = 0;
        }
        else {
          iVar4 = (int)in_stack_fffffffffffff808;
          _w = (int)((ulong)in_stack_fffffffffffff808 >> 0x20);
          if (local_4c == 2) {
            local_50 = (local_40 * local_34) /
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            local_58 = (local_30 / (ulong)(long)local_34) *
                       (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            local_18 = in_RSI;
            ncnn::Mat::create(in_stack_fffffffffffff810,_w,iVar4,in_stack_fffffffffffff800,
                              (int)((ulong)in_stack_fffffffffffff7f8 >> 0x20),
                              (Allocator *)in_stack_fffffffffffff7f0);
            bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff7f0);
            if (bVar1) {
              local_4 = -100;
            }
            else {
              if ((local_35 & 1U) != 0) {
                for (local_5c = 0; local_5c < local_50; local_5c = local_5c + 1) {
                  local_68 = ncnn::Mat::row<signed_char_const>(local_18,local_5c << 3);
                  local_70 = ncnn::Mat::row<signed_char_const>(local_18,local_5c * 8 + 1);
                  local_78 = ncnn::Mat::row<signed_char_const>(local_18,local_5c * 8 + 2);
                  local_80 = ncnn::Mat::row<signed_char_const>(local_18,local_5c * 8 + 3);
                  local_88 = ncnn::Mat::row<signed_char_const>(local_18,local_5c * 8 + 4);
                  local_90 = ncnn::Mat::row<signed_char_const>(local_18,local_5c * 8 + 5);
                  local_98 = ncnn::Mat::row<signed_char_const>(local_18,local_5c * 8 + 6);
                  local_a0 = ncnn::Mat::row<signed_char_const>(local_18,local_5c * 8 + 7);
                  local_a8 = ncnn::Mat::row<signed_char>(local_20,local_5c);
                  for (local_ac = 0; local_ac < local_3c; local_ac = local_ac + 1) {
                    *local_a8 = *local_68;
                    local_a8[1] = *local_70;
                    local_a8[2] = *local_78;
                    local_a8[3] = *local_80;
                    local_a8[4] = *local_88;
                    local_a8[5] = *local_90;
                    local_a8[6] = *local_98;
                    local_a8[7] = *local_a0;
                    local_a8 = local_a8 + 8;
                    local_a0 = local_a0 + 1;
                    local_98 = local_98 + 1;
                    local_90 = local_90 + 1;
                    local_88 = local_88 + 1;
                    local_80 = local_80 + 1;
                    local_78 = local_78 + 1;
                    local_70 = local_70 + 1;
                    local_68 = local_68 + 1;
                  }
                }
              }
              if ((local_36 & 1U) != 0) {
                for (local_b0 = 0; local_b0 < local_40; local_b0 = local_b0 + 1) {
                  local_b8 = ncnn::Mat::row<signed_char_const>(local_18,local_b0);
                  local_c0 = ncnn::Mat::row<signed_char>(local_20,local_b0 << 3);
                  local_c8 = ncnn::Mat::row<signed_char>(local_20,local_b0 * 8 + 1);
                  local_d0 = ncnn::Mat::row<signed_char>(local_20,local_b0 * 8 + 2);
                  local_d8 = ncnn::Mat::row<signed_char>(local_20,local_b0 * 8 + 3);
                  local_e0 = ncnn::Mat::row<signed_char>(local_20,local_b0 * 8 + 4);
                  local_e8 = ncnn::Mat::row<signed_char>(local_20,local_b0 * 8 + 5);
                  local_f0 = ncnn::Mat::row<signed_char>(local_20,local_b0 * 8 + 6);
                  local_f8 = ncnn::Mat::row<signed_char>(local_20,local_b0 * 8 + 7);
                  for (local_fc = 0; local_fc < local_3c; local_fc = local_fc + 1) {
                    *local_c0 = *local_b8;
                    *local_c8 = local_b8[1];
                    *local_d0 = local_b8[2];
                    *local_d8 = local_b8[3];
                    *local_e0 = local_b8[4];
                    *local_e8 = local_b8[5];
                    *local_f0 = local_b8[6];
                    *local_f8 = local_b8[7];
                    local_b8 = local_b8 + 8;
                    local_f8 = local_f8 + 1;
                    local_f0 = local_f0 + 1;
                    local_e8 = local_e8 + 1;
                    local_e0 = local_e0 + 1;
                    local_d8 = local_d8 + 1;
                    local_d0 = local_d0 + 1;
                    local_c8 = local_c8 + 1;
                    local_c0 = local_c0 + 1;
                  }
                }
              }
              local_4 = 0;
            }
          }
          else if ((local_4c == 3) || (local_4c == 4)) {
            local_100 = local_3c * local_40 * local_44;
            local_104 = (local_48 * local_34) /
                        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            local_110 = (local_30 / (ulong)(long)local_34) *
                        (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            _d = (int)(in_stack_fffffffffffff800 >> 0x20);
            if (local_4c == 3) {
              ncnn::Mat::create(in_stack_fffffffffffff810,_w,iVar4,_d,
                                (size_t)in_stack_fffffffffffff7f8,
                                (int)((ulong)in_stack_fffffffffffff7f0 >> 0x20),
                                in_stack_fffffffffffff820);
            }
            else {
              in_stack_fffffffffffff7f0 = *(Mat **)(in_RCX + 8);
              ncnn::Mat::create(in_stack_fffffffffffff810,_w,iVar4,_d,(int)in_stack_fffffffffffff800
                                ,(size_t)in_stack_fffffffffffff7f8,(int)in_stack_fffffffffffff820,
                                in_stack_fffffffffffff828);
            }
            bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff7f0);
            if (bVar1) {
              local_4 = -100;
            }
            else {
              if ((local_35 & 1U) != 0) {
                for (local_114 = 0; local_114 < local_104; local_114 = local_114 + 1) {
                  ncnn::Mat::channel(in_stack_fffffffffffff818,
                                     (int)((ulong)in_stack_fffffffffffff810 >> 0x20));
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(&local_168);
                  ncnn::Mat::~Mat((Mat *)0x70e7ca);
                  local_120 = pcVar2;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,
                                     (int)((ulong)in_stack_fffffffffffff810 >> 0x20));
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(&local_1c8);
                  ncnn::Mat::~Mat((Mat *)0x70e82b);
                  local_180 = pcVar2;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,
                                     (int)((ulong)in_stack_fffffffffffff810 >> 0x20));
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(&local_218);
                  ncnn::Mat::~Mat((Mat *)0x70e88c);
                  local_1d0 = pcVar2;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,
                                     (int)((ulong)in_stack_fffffffffffff810 >> 0x20));
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(&local_268);
                  ncnn::Mat::~Mat((Mat *)0x70e8ed);
                  local_220 = pcVar2;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,
                                     (int)((ulong)in_stack_fffffffffffff810 >> 0x20));
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(&local_2b8);
                  ncnn::Mat::~Mat((Mat *)0x70e94e);
                  local_270 = pcVar2;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,
                                     (int)((ulong)in_stack_fffffffffffff810 >> 0x20));
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(&local_308);
                  ncnn::Mat::~Mat((Mat *)0x70e9af);
                  local_2c0 = pcVar2;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,
                                     (int)((ulong)in_stack_fffffffffffff810 >> 0x20));
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(&local_358);
                  ncnn::Mat::~Mat((Mat *)0x70ea10);
                  local_310 = pcVar2;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,
                                     (int)((ulong)in_stack_fffffffffffff810 >> 0x20));
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(&local_3a8);
                  ncnn::Mat::~Mat((Mat *)0x70ea71);
                  local_360 = pcVar2;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,
                                     (int)((ulong)in_stack_fffffffffffff810 >> 0x20));
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(&local_3f8);
                  ncnn::Mat::~Mat((Mat *)0x70eac9);
                  local_3b0 = pcVar2;
                  for (local_3fc = 0; local_3fc < local_100; local_3fc = local_3fc + 1) {
                    *local_3b0 = *local_120;
                    local_3b0[1] = *local_180;
                    local_3b0[2] = *local_1d0;
                    local_3b0[3] = *local_220;
                    local_3b0[4] = *local_270;
                    local_3b0[5] = *local_2c0;
                    local_3b0[6] = *local_310;
                    local_3b0[7] = *local_360;
                    local_3b0 = local_3b0 + 8;
                    local_360 = local_360 + 1;
                    local_310 = local_310 + 1;
                    local_2c0 = local_2c0 + 1;
                    local_270 = local_270 + 1;
                    local_220 = local_220 + 1;
                    local_1d0 = local_1d0 + 1;
                    local_180 = local_180 + 1;
                    local_120 = local_120 + 1;
                  }
                }
              }
              if ((local_36 & 1U) != 0) {
                for (local_400 = 0; iVar4 = (int)((ulong)in_stack_fffffffffffff810 >> 0x20),
                    local_400 < local_48; local_400 = local_400 + 1) {
                  ncnn::Mat::channel(in_stack_fffffffffffff818,iVar4);
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(&local_450);
                  ncnn::Mat::~Mat((Mat *)0x70ee26);
                  local_408 = pcVar2;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,iVar4);
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(&local_4a0);
                  ncnn::Mat::~Mat((Mat *)0x70ee81);
                  local_458 = pcVar2;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,iVar4);
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(&local_4f0);
                  ncnn::Mat::~Mat((Mat *)0x70eed9);
                  local_4a8 = pcVar2;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,iVar4);
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(&local_540);
                  ncnn::Mat::~Mat((Mat *)0x70ef2e);
                  local_4f8 = pcVar2;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,iVar4);
                  local_548 = ncnn::Mat::operator_cast_to_signed_char_
                                        ((Mat *)&stack0xfffffffffffffa70);
                  ncnn::Mat::~Mat((Mat *)0x70ef83);
                  pMVar3 = &local_5e0;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,iVar4);
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(pMVar3);
                  ncnn::Mat::~Mat((Mat *)0x70efd8);
                  in_stack_fffffffffffff818 = &local_630;
                  local_598 = pcVar2;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,iVar4);
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(in_stack_fffffffffffff818);
                  ncnn::Mat::~Mat((Mat *)0x70f02d);
                  pMVar3 = &local_680;
                  local_5e8 = pcVar2;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,iVar4);
                  in_stack_fffffffffffff810 =
                       (Mat *)ncnn::Mat::operator_cast_to_signed_char_(pMVar3);
                  ncnn::Mat::~Mat((Mat *)0x70f082);
                  pMVar3 = &local_6d0;
                  local_638 = in_stack_fffffffffffff810;
                  ncnn::Mat::channel(in_stack_fffffffffffff818,
                                     (int)((ulong)in_stack_fffffffffffff810 >> 0x20));
                  pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(pMVar3);
                  ncnn::Mat::~Mat((Mat *)0x70f0d7);
                  local_688 = pcVar2;
                  for (local_6d4 = 0; local_6d4 < local_100; local_6d4 = local_6d4 + 1) {
                    *local_458 = *local_408;
                    *local_4a8 = local_408[1];
                    *local_4f8 = local_408[2];
                    *local_548 = local_408[3];
                    *local_598 = local_408[4];
                    *local_5e8 = local_408[5];
                    *(char *)&local_638->data = local_408[6];
                    *local_688 = local_408[7];
                    local_408 = local_408 + 8;
                    local_688 = local_688 + 1;
                    local_638 = (Mat *)((long)&local_638->data + 1);
                    local_5e8 = local_5e8 + 1;
                    local_598 = local_598 + 1;
                    local_548 = local_548 + 1;
                    local_4f8 = local_4f8 + 1;
                    local_4a8 = local_4a8 + 1;
                    local_458 = local_458 + 1;
                  }
                }
              }
              local_4 = 0;
            }
          }
          else {
            local_4 = 0;
          }
        }
      }
    }
  }
  else {
    local_4 = Packing::forward(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                               in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  }
  return local_4;
}

Assistant:

int Packing_x86_avx::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (use_padding)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    bool pack1to8 = elempack == 1 && out_elempack == 8;
    bool pack8to1 = elempack == 8 && out_elempack == 1;

    if (!pack1to8 && !pack8to1)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        top_blob = bottom_blob;
        top_blob.w = w * elempack / out_elempack;
        top_blob.cstep = w * elempack / out_elempack;
        top_blob.elemsize = elemsize / elempack * out_elempack;
        top_blob.elempack = out_elempack;
        return 0;
    }

    if (dims == 2)
    {
        int outh = h * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const signed char* r0 = bottom_blob.row<const signed char>(i * 8);
                const signed char* r1 = bottom_blob.row<const signed char>(i * 8 + 1);
                const signed char* r2 = bottom_blob.row<const signed char>(i * 8 + 2);
                const signed char* r3 = bottom_blob.row<const signed char>(i * 8 + 3);
                const signed char* r4 = bottom_blob.row<const signed char>(i * 8 + 4);
                const signed char* r5 = bottom_blob.row<const signed char>(i * 8 + 5);
                const signed char* r6 = bottom_blob.row<const signed char>(i * 8 + 6);
                const signed char* r7 = bottom_blob.row<const signed char>(i * 8 + 7);

                signed char* outptr = top_blob.row<signed char>(i);

                int j = 0;
                for (; j < w; j++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const signed char* r0 = bottom_blob.row<const signed char>(i);

                signed char* outptr0 = top_blob.row<signed char>(i * 8);
                signed char* outptr1 = top_blob.row<signed char>(i * 8 + 1);
                signed char* outptr2 = top_blob.row<signed char>(i * 8 + 2);
                signed char* outptr3 = top_blob.row<signed char>(i * 8 + 3);
                signed char* outptr4 = top_blob.row<signed char>(i * 8 + 4);
                signed char* outptr5 = top_blob.row<signed char>(i * 8 + 5);
                signed char* outptr6 = top_blob.row<signed char>(i * 8 + 6);
                signed char* outptr7 = top_blob.row<signed char>(i * 8 + 7);

                int j = 0;
                for (; j < w; j++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int size = w * h * d;
        int outc = channels * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 3)
            top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        else // if (dims == 4)
            top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const signed char* r0 = bottom_blob.channel(q * 8);
                const signed char* r1 = bottom_blob.channel(q * 8 + 1);
                const signed char* r2 = bottom_blob.channel(q * 8 + 2);
                const signed char* r3 = bottom_blob.channel(q * 8 + 3);
                const signed char* r4 = bottom_blob.channel(q * 8 + 4);
                const signed char* r5 = bottom_blob.channel(q * 8 + 5);
                const signed char* r6 = bottom_blob.channel(q * 8 + 6);
                const signed char* r7 = bottom_blob.channel(q * 8 + 7);

                signed char* outptr = top_blob.channel(q);

                int i = 0;
                for (; i < size; i++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* r0 = bottom_blob.channel(q);

                signed char* outptr0 = top_blob.channel(q * 8);
                signed char* outptr1 = top_blob.channel(q * 8 + 1);
                signed char* outptr2 = top_blob.channel(q * 8 + 2);
                signed char* outptr3 = top_blob.channel(q * 8 + 3);
                signed char* outptr4 = top_blob.channel(q * 8 + 4);
                signed char* outptr5 = top_blob.channel(q * 8 + 5);
                signed char* outptr6 = top_blob.channel(q * 8 + 6);
                signed char* outptr7 = top_blob.channel(q * 8 + 7);

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }

        return 0;
    }

    return 0;
}